

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateInlineMethods
          (MessageGenerator *this,Printer *p)

{
  Descriptor *this_00;
  ushort *puVar1;
  bool bVar2;
  value_type desc;
  Options *in_RCX;
  cpp *this_01;
  undefined1 cap_next_letter;
  char *pcVar3;
  long lVar4;
  Span<const_google::protobuf::io::Printer::Sub> vars;
  Span<const_google::protobuf::io::Printer::Sub> vars_00;
  string_view input;
  Iterator __begin3;
  Iterator __end3;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  t;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  v;
  anon_class_1_0_00000001 local_605;
  int local_604;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  Printer *local_580;
  string local_578;
  string local_558;
  Iterator local_538;
  Iterator local_528;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_518;
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_io_printer_h:1166:28)>
  local_500;
  AnnotationRecord local_4e8;
  AlphaNum *local_4a8;
  pointer local_4a0;
  undefined1 local_478 [184];
  AlphaNum local_3c0;
  undefined1 local_390 [48];
  ulong local_360;
  AlphaNum *local_358;
  char acStack_338 [8];
  Sub local_330;
  Sub local_278;
  Sub local_1c0;
  Options local_108;
  
  this_00 = this->descriptor_;
  Options::Options(&local_108,&this->options_);
  cpp::anon_unknown_0::ClassVars
            ((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
              *)&local_330,(anon_unknown_0 *)this_00,(Descriptor *)&local_108,in_RCX);
  vars.len_ = ((long)(local_330.key_._M_string_length - (long)local_330.key_._M_dataplus._M_p) >> 3)
              * -0x2c8590b21642c859;
  vars.ptr_ = (pointer)local_330.key_._M_dataplus._M_p;
  io::Printer::WithDefs(&local_500,p,vars,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_330);
  absl::lts_20250127::container_internal::
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~raw_hash_set(&local_108.field_listener_options.forbidden_field_listener_events.
                   super_raw_hash_set<absl::lts_20250127::container_internal::FlatHashSetPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.annotation_guard_name._M_dataplus._M_p !=
      &local_108.annotation_guard_name.field_2) {
    operator_delete(local_108.annotation_guard_name._M_dataplus._M_p,
                    local_108.annotation_guard_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.annotation_pragma_name._M_dataplus._M_p !=
      &local_108.annotation_pragma_name.field_2) {
    operator_delete(local_108.annotation_pragma_name._M_dataplus._M_p,
                    local_108.annotation_pragma_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.runtime_include_base._M_dataplus._M_p != &local_108.runtime_include_base.field_2)
  {
    operator_delete(local_108.runtime_include_base._M_dataplus._M_p,
                    local_108.runtime_include_base.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.dllexport_decl._M_dataplus._M_p != &local_108.dllexport_decl.field_2) {
    operator_delete(local_108.dllexport_decl._M_dataplus._M_p,
                    local_108.dllexport_decl.field_2._M_allocated_capacity + 1);
  }
  MakeTrackerCalls((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
                    *)&local_330,this->descriptor_,&this->options_);
  vars_00.len_ = ((long)(local_330.key_._M_string_length - (long)local_330.key_._M_dataplus._M_p) >>
                 3) * -0x2c8590b21642c859;
  pcVar3 = (char *)0x0;
  vars_00.ptr_ = (pointer)local_330.key_._M_dataplus._M_p;
  io::Printer::WithDefs(&local_518,p,vars_00,false);
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  ~vector((vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *)&local_330);
  if ((this->descriptor_->options_->field_0)._impl_.map_entry_ == false) {
    local_580 = p;
    GenerateFieldAccessorDefinitions(this,p);
    local_538.descriptor = this->descriptor_;
    local_538.idx = 0;
    local_528.idx = (local_538.descriptor)->real_oneof_decl_count_;
    local_528.descriptor = local_538.descriptor;
    while( true ) {
      cap_next_letter = SUB81(pcVar3,0);
      bVar2 = cpp::operator==(&local_538,&local_528);
      if (bVar2) break;
      desc = OneOfRangeImpl::Iterator::operator*(&local_538);
      local_600._M_dataplus._M_p = (pointer)&local_600.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_600,"oneof_name","");
      puVar1 = (ushort *)(desc->all_names_).payload_;
      local_360 = (ulong)*puVar1;
      local_358 = (AlphaNum *)((long)puVar1 + ~local_360);
      local_390._0_8_ = 5;
      local_390._8_8_ = "_case";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_558,(lts_20250127 *)&local_360,(AlphaNum *)local_390,local_358);
      io::Printer::Sub::Sub<std::__cxx11::string>((Sub *)local_478,&local_600,&local_558);
      io::Printer::AnnotationRecord::AnnotationRecord<google::protobuf::OneofDescriptor,_0>
                (&local_4e8,desc,(optional<google::protobuf::io::AnnotationCollector::Semantic>)0x0)
      ;
      io::Printer::Sub::AnnotatedAs(&local_330,(Sub *)local_478,&local_4e8);
      local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5a0,"OneofName","");
      puVar1 = (ushort *)(desc->all_names_).payload_;
      this_01 = (cpp *)(ulong)*puVar1;
      input._M_len = (long)puVar1 + ~(ulong)this_01;
      input._M_str = (char *)0x1;
      UnderscoresToCamelCase_abi_cxx11_(&local_5c0,this_01,input,(bool)cap_next_letter);
      local_4a8 = (AlphaNum *)local_5c0._M_string_length;
      local_4a0 = local_5c0._M_dataplus._M_p;
      local_3c0.piece_._M_len = 4;
      local_3c0.piece_._M_str = "Case";
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_578,(lts_20250127 *)&local_4a8,&local_3c0,
                 (AlphaNum *)local_5c0._M_string_length);
      io::Printer::Sub::Sub<std::__cxx11::string>(&local_278,&local_5a0,&local_578);
      local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_5e0,"oneof_index","");
      local_604 = (int)((ulong)((long)desc - (long)desc->containing_type_->oneof_decls_) >> 3) *
                  -0x49249249;
      io::Printer::Sub::Sub<int>(&local_1c0,&local_5e0,&local_604);
      pcVar3 = 
      "\n          inline $classname$::$OneofName$ $classname$::$oneof_name$() const {\n            return $classname$::$OneofName$($oneof_case$[$oneof_index$]);\n          }\n        "
      ;
      io::Printer::Emit(local_580,&local_330,3,0xad);
      lVar4 = 0x228;
      do {
        if (acStack_338[lVar4] == '\x01') {
          std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                    ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                     (local_390 + lVar4 + 0x18));
        }
        if ((long *)(local_390 + lVar4) != *(long **)(local_3c0.digits_ + lVar4 + 0x10)) {
          operator_delete(*(long **)(local_3c0.digits_ + lVar4 + 0x10),
                          *(long *)(local_390 + lVar4) + 1);
        }
        (*std::__detail::__variant::
          __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
          ::_S_vtable._M_arr[(byte)local_3c0.digits_[lVar4 + 8]]._M_data)
                  (&local_605,
                   (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                    *)(local_478 + lVar4 + 0xb0));
        local_3c0.digits_[lVar4 + 8] = -1;
        if ((long *)(local_478 + lVar4 + 0xa0) != *(long **)(local_478 + lVar4 + 0x90)) {
          operator_delete(*(long **)(local_478 + lVar4 + 0x90),
                          *(long *)(local_478 + lVar4 + 0xa0) + 1);
        }
        lVar4 = lVar4 + -0xb8;
      } while (lVar4 != 0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
        operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_578._M_dataplus._M_p != &local_578.field_2) {
        operator_delete(local_578._M_dataplus._M_p,local_578.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c0._M_dataplus._M_p != &local_5c0.field_2) {
        operator_delete(local_5c0._M_dataplus._M_p,local_5c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
        operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e8.file_path._M_dataplus._M_p != &local_4e8.file_path.field_2) {
        operator_delete(local_4e8.file_path._M_dataplus._M_p,
                        local_4e8.file_path.field_2._M_allocated_capacity + 1);
      }
      if (local_4e8.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_4e8.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_4e8.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_4e8.path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_478[0xb0] == true) {
        std::_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord>::_M_destroy
                  ((_Optional_payload_base<google::protobuf::io::Printer::AnnotationRecord> *)
                   (local_478 + 0x70));
      }
      if ((undefined1 *)local_478._72_8_ != local_478 + 0x58) {
        operator_delete((void *)local_478._72_8_,local_478._88_8_ + 1);
      }
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>_&>
        ::_S_vtable._M_arr[local_478[0x40]]._M_data)
                ((anon_class_1_0_00000001 *)&local_4a8,
                 (variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<bool_()>_>
                  *)(local_478 + 0x20));
      local_478[0x40] = 0xff;
      if ((undefined1 *)local_478._0_8_ != local_478 + 0x10) {
        operator_delete((void *)local_478._0_8_,local_478._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_600._M_dataplus._M_p != &local_600.field_2) {
        operator_delete(local_600._M_dataplus._M_p,local_600.field_2._M_allocated_capacity + 1);
      }
      local_538.idx = local_538.idx + 1;
    }
  }
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_518);
  absl::lts_20250127::
  Cleanup<absl::lts_20250127::cleanup_internal::Tag,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.h:1166:28)>
  ::~Cleanup(&local_500);
  return;
}

Assistant:

void MessageGenerator::GenerateInlineMethods(io::Printer* p) {
  auto v = p->WithVars(ClassVars(descriptor_, options_));
  auto t = p->WithVars(MakeTrackerCalls(descriptor_, options_));
  if (IsMapEntryMessage(descriptor_)) return;
  GenerateFieldAccessorDefinitions(p);

  // Generate oneof_case() functions.
  for (auto oneof : OneOfRange(descriptor_)) {
    p->Emit(
        {
            Sub{"oneof_name", absl::StrCat(oneof->name(), "_case")}.AnnotatedAs(
                oneof),
            {"OneofName",
             absl::StrCat(UnderscoresToCamelCase(oneof->name(), true), "Case")},
            {"oneof_index", oneof->index()},
        },
        R"cc(
          inline $classname$::$OneofName$ $classname$::$oneof_name$() const {
            return $classname$::$OneofName$($oneof_case$[$oneof_index$]);
          }
        )cc");
  }
}